

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::ClassId(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> aStack_1fb31;
  string sStack_1fb30;
  TPZFrontNonSym<std::complex<float>_> TStack_1fb10;
  TPZStackEqnStorage<std::complex<float>_> TStack_1f9e8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1fb30,"TPZFrontMatrix",&aStack_1fb31);
  uVar1 = Hash(&sStack_1fb30);
  iVar2 = TPZAbstractFrontMatrix<std::complex<float>_>::ClassId
                    (&this->super_TPZAbstractFrontMatrix<std::complex<float>_>);
  TPZStackEqnStorage<std::complex<float>_>::TPZStackEqnStorage(&TStack_1f9e8);
  iVar3 = TPZStackEqnStorage<std::complex<float>_>::ClassId(&TStack_1f9e8);
  TPZFrontNonSym<std::complex<float>_>::TPZFrontNonSym(&TStack_1fb10);
  iVar4 = TPZFrontNonSym<std::complex<float>_>::ClassId(&TStack_1fb10);
  TPZFrontNonSym<std::complex<float>_>::~TPZFrontNonSym(&TStack_1fb10);
  TPZStackEqnStorage<std::complex<float>_>::~TPZStackEqnStorage(&TStack_1f9e8);
  std::__cxx11::string::~string((string *)&sStack_1fb30);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}